

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
detail::reader::operator()
          (reader *this,
          flat_map<boost::basic_string_ref<char,_std::char_traits<char>_>,_boost::basic_string_ref<char,_std::char_traits<char>_>,_std::less<boost::basic_string_ref<char,_std::char_traits<char>_>_>,_void>
          *val)

{
  flat_map<boost::basic_string_ref<char,std::char_traits<char>>,boost::basic_string_ref<char,std::char_traits<char>>,std::less<boost::basic_string_ref<char,std::char_traits<char>>>,void>
  local_50 [16];
  undefined1 local_40 [8];
  basic_string_ref<char,_std::char_traits<char>_> value;
  basic_string_ref<char,_std::char_traits<char>_> key;
  uint16_t length;
  flat_map<boost::basic_string_ref<char,_std::char_traits<char>_>,_boost::basic_string_ref<char,_std::char_traits<char>_>,_std::less<boost::basic_string_ref<char,_std::char_traits<char>_>_>,_void>
  *val_local;
  reader *this_local;
  
  key.len_._6_2_ = 0;
  operator()(this,(unsigned_short *)((long)&key.len_ + 6));
  for (; key.len_._6_2_ != 0; key.len_._6_2_ = key.len_._6_2_ + -1) {
    boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref
              ((basic_string_ref<char,_std::char_traits<char>_> *)&value.len_);
    operator()(this,(string_ref *)&value.len_);
    boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref
              ((basic_string_ref<char,_std::char_traits<char>_> *)local_40);
    operator()(this,(string_ref *)local_40);
    boost::container::
    flat_map<boost::basic_string_ref<char,std::char_traits<char>>,boost::basic_string_ref<char,std::char_traits<char>>,std::less<boost::basic_string_ref<char,std::char_traits<char>>>,void>
    ::
    emplace<boost::basic_string_ref<char,std::char_traits<char>>&,boost::basic_string_ref<char,std::char_traits<char>>&>
              (local_50,(basic_string_ref<char,_std::char_traits<char>_> *)val,
               (basic_string_ref<char,_std::char_traits<char>_> *)&value.len_);
  }
  return;
}

Assistant:

void operator()(boost::container::flat_map<K,V>& val) const {
        uint16_t length = 0;
        (*this)(length);
        for (; length; --length) {
            K key;
            (*this)(key);
            V value;
            (*this)(value);
            val.emplace(key,value);
        }
    }